

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O1

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromCollations(CollationLoader *this,UErrorCode *errorCode)

{
  char *inKey;
  uint uVar1;
  int iVar2;
  int iVar3;
  UResourceBundle *p;
  LocalPointerBase<UResourceBundle> resourceBundle;
  size_t sVar4;
  char *__s1;
  CollationCacheEntry *pCVar5;
  char *pcVar6;
  Locale *pLVar7;
  LocalUResourceBundlePointer localData;
  LocalUResourceBundlePointer local_120;
  int local_114;
  Locale local_110;
  
  if (U_ZERO_ERROR < *errorCode) {
    return (CollationCacheEntry *)0x0;
  }
  inKey = this->type;
  pLVar7 = (Locale *)inKey;
  resourceBundle.ptr =
       ures_getByKeyWithFallback_63(this->collations,inKey,(UResourceBundle *)0x0,errorCode);
  local_120.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)(LocalPointerBase<UResourceBundle>)resourceBundle.ptr;
  if (*errorCode == U_MISSING_RESOURCE_ERROR) {
    sVar4 = strlen(inKey);
    *errorCode = U_USING_DEFAULT_WARNING;
    this->typeFallback = '\x01';
    uVar1 = this->typesTried;
    if ((((uVar1 & 1) == 0) && (6 < (int)sVar4)) &&
       (*(short *)(this->type + 4) == 0x6863 && *(int *)inKey == 0x72616573)) {
      this->typesTried = uVar1 | 1;
      this->type[6] = '\0';
    }
    else if ((uVar1 & 2) == 0) {
      this->typesTried = uVar1 | 2;
      strcpy(inKey,this->defaultType);
    }
    else {
      if ((uVar1 & 4) != 0) {
        pCVar5 = makeCacheEntryFromRoot(this,pLVar7,errorCode);
        goto LAB_0021e1b7;
      }
      this->typesTried = uVar1 | 4;
      builtin_strncpy(inKey,"standard",9);
    }
    Locale::setKeywordValue(&this->locale,"collation",inKey,errorCode);
    pCVar5 = getCacheEntry(this,errorCode);
    goto LAB_0021e1b7;
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_120.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)(UResourceBundle *)0x0;
    this->data = resourceBundle.ptr;
    __s1 = ures_getLocaleByType_63(resourceBundle.ptr,ULOC_ACTUAL_LOCALE,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pLVar7 = &this->validLocale;
      pcVar6 = Locale::getBaseName(pLVar7);
      iVar2 = strcmp(__s1,pcVar6);
      pcVar6 = this->defaultType;
      iVar3 = strcmp(inKey,pcVar6);
      if (iVar3 != 0) {
        pcVar6 = "collation";
        Locale::setKeywordValue(pLVar7,"collation",inKey,errorCode);
        if (U_ZERO_ERROR < *errorCode) goto LAB_0021e14a;
      }
      if (*__s1 == '\0') {
LAB_0021e23d:
        if (this->type[8] == '\0' && *(long *)inKey == 0x647261646e617473) {
          if (this->typeFallback != '\0') {
            *errorCode = U_USING_DEFAULT_WARNING;
          }
          pCVar5 = makeCacheEntryFromRoot(this,(Locale *)pcVar6,errorCode);
          goto LAB_0021e1b7;
        }
      }
      else {
        pcVar6 = "root";
        iVar3 = strcmp(__s1,"root");
        if (iVar3 == 0) goto LAB_0021e23d;
      }
      local_114 = iVar2;
      Locale::Locale(&local_110,__s1,(char *)0x0,(char *)0x0,(char *)0x0);
      Locale::operator=(&this->locale,&local_110);
      Locale::~Locale(&local_110);
      if (local_114 == 0) {
        pCVar5 = loadFromData(this,errorCode);
      }
      else {
        Locale::setKeywordValue(&this->locale,"collation",inKey,errorCode);
        pCVar5 = getCacheEntry(this,errorCode);
        pCVar5 = makeCacheEntry(pLVar7,pCVar5,errorCode);
      }
      goto LAB_0021e1b7;
    }
  }
LAB_0021e14a:
  pCVar5 = (CollationCacheEntry *)0x0;
LAB_0021e1b7:
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_120);
  return pCVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}